

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

void __thiscall cmValueWithOrigin::~cmValueWithOrigin(cmValueWithOrigin *this)

{
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&(this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>)
  ;
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmValueWithOrigin(const std::string &value,
                          const cmListFileBacktrace &bt)
    : Value(value), Backtrace(bt)
  {}